

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Select_Game.cpp
# Opt level: O2

double __thiscall SelectGame::selectGame_Option(SelectGame *this,double *credits)

{
  double *pdVar1;
  int iVar2;
  ostream *poVar3;
  char cVar4;
  double dVar5;
  PrintGameName printWelcome;
  uint bet;
  Matrix myMatrix;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  myMatrixVector;
  string option;
  Bet currentBet;
  CreditField addCredit;
  PrintGameName local_12d;
  uint local_12c;
  double *local_128;
  Matrix local_120;
  Bet local_108;
  undefined8 local_f8;
  char *local_f0;
  long local_e8;
  char local_e0 [16];
  Bet local_d0;
  Start local_c0;
  SelectGame *local_98;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_90;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_78;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_60;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_48;
  
  local_f0 = local_e0;
  local_e8 = 0;
  local_e0[0] = '\0';
  local_128 = credits;
  local_98 = this;
  do {
    selectGame_Welcome(local_98);
    poVar3 = std::operator<<((ostream *)&std::cout,"-------------------------------------");
    std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = std::operator<<((ostream *)&std::cout,"Choose a game which you want to Play!");
    std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = std::operator<<((ostream *)&std::cout,"-------------------------------------");
    std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = std::operator<<((ostream *)&std::cout,"Option: 1 for SuperFire 5");
    std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = std::operator<<((ostream *)&std::cout,"Option: 2 for SuperFire 10");
    std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = std::operator<<((ostream *)&std::cout,"Option: 3 for Wise Pharaohs 5");
    std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = std::operator<<((ostream *)&std::cout,"Option: 4 for Tiger\'s Battle 10");
    std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = std::operator<<((ostream *)&std::cout,"Option: 5 for Keno");
    std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = std::operator<<((ostream *)&std::cout,"-------------------------------------");
    std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = std::operator<<((ostream *)&std::cout,"Press a to add credit!");
    std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = std::operator<<((ostream *)&std::cout,"Press c to exit!");
    std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = std::operator<<((ostream *)&std::cout,"-------------------------------------");
    std::endl<char,std::char_traits<char>>(poVar3);
    std::operator<<((ostream *)&std::cout,"Current Credit: ");
    poVar3 = std::ostream::_M_insert<double>(*credits);
    poVar3 = std::operator<<(poVar3," Euro!");
    std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = std::operator<<((ostream *)&std::cout,"-------------------------------------");
    std::endl<char,std::char_traits<char>>(poVar3);
    std::operator>>((istream *)&std::cin,(string *)&local_f0);
    cVar4 = *local_f0;
    if (local_e8 == 1 && cVar4 == 'a') {
      CreditField::CreditField((CreditField *)&local_c0);
      CreditField::AddCredit((CreditField *)&local_c0,credits);
      CreditField::~CreditField((CreditField *)&local_c0);
      cVar4 = *local_f0;
    }
    if ((cVar4 == 'c') && (local_e8 == 1)) {
      if (*credits <= 0.0) {
        poVar3 = std::operator<<((ostream *)&std::cout,"Nothing to cashout!");
        std::endl<char,std::char_traits<char>>(poVar3);
        local_c0.super_Matrix._matrixVec.
        super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x3;
        std::this_thread::sleep_for<long,std::ratio<1l,1l>>
                  ((duration<long,_std::ratio<1L,_1L>_> *)&local_c0);
      }
      else {
        poVar3 = std::operator<<((ostream *)&std::cout,"Cashout...");
        std::endl<char,std::char_traits<char>>(poVar3);
        std::operator<<((ostream *)&std::cout,"Handpay! Call Attendant! ");
        poVar3 = std::ostream::_M_insert<double>(*credits);
        poVar3 = std::operator<<(poVar3," Euro!");
        std::endl<char,std::char_traits<char>>(poVar3);
        local_c0.super_Matrix._matrixVec.
        super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x3;
        std::this_thread::sleep_for<long,std::ratio<1l,1l>>
                  ((duration<long,_std::ratio<1L,_1L>_> *)&local_c0);
        *credits = 0.0;
      }
    }
    cVar4 = *local_f0;
    if (local_e8 == 1 && cVar4 == '1') {
      iVar2 = system("CLS");
      if (iVar2 != 0) {
        system("clear");
      }
      PrintGameName::PrintGameName(&local_12d);
      PrintGameName::PrintGameNameWelcome(&local_12d);
      dVar5 = *credits;
      if (dVar5 < 1.0) {
        poVar3 = std::operator<<((ostream *)&std::cout,
                                 "Please Insert Credits in order to play. Minimum is 1 Euro for Min Bet!"
                                );
        std::endl<char,std::char_traits<char>>(poVar3);
        poVar3 = std::operator<<((ostream *)&std::cout,
                                 "----------------------------------------------------------------------"
                                );
        std::endl<char,std::char_traits<char>>(poVar3);
        CreditField::CreditField((CreditField *)&local_c0);
        CreditField::AddCredit((CreditField *)&local_c0,credits);
        CreditField::~CreditField((CreditField *)&local_c0);
        dVar5 = *credits;
      }
      local_12c = 0;
      Bet::Bet(&local_d0,0,dVar5);
      Bet::selectBet(&local_d0,&local_12c,credits);
      local_108._bet_bet = 0;
      local_108._4_4_ = 0;
      local_108._credit_bet = 0.0;
      local_f8 = 0;
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::vector(&local_48,
               (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                *)&local_108);
      Matrix::Matrix(&local_120,&local_48);
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::~vector(&local_48);
      Start::Start(&local_c0,*credits,local_12c);
      Start::StartGameNow(&local_c0,credits,&local_12c);
      Start::~Start(&local_c0);
      Matrix::~Matrix(&local_120);
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 *)&local_108);
      Bet::~Bet(&local_d0);
      PrintGameName::~PrintGameName(&local_12d);
      cVar4 = *local_f0;
    }
    if (local_e8 == 1 && cVar4 == '2') {
      iVar2 = system("CLS");
      if (iVar2 != 0) {
        system("clear");
      }
      PrintGameName::PrintGameName(&local_12d);
      PrintGameName::PrintGameNameWelcomeSuperFire10(&local_12d);
      dVar5 = *credits;
      if (dVar5 < 2.0) {
        poVar3 = std::operator<<((ostream *)&std::cout,
                                 "Please Insert Credits in order to play. Minimum is 2 Euro for Min Bet!"
                                );
        std::endl<char,std::char_traits<char>>(poVar3);
        poVar3 = std::operator<<((ostream *)&std::cout,
                                 "----------------------------------------------------------------------"
                                );
        std::endl<char,std::char_traits<char>>(poVar3);
        CreditField::CreditField((CreditField *)&local_c0);
        CreditField::AddCredit((CreditField *)&local_c0,credits);
        CreditField::~CreditField((CreditField *)&local_c0);
        dVar5 = *credits;
      }
      local_12c = 0;
      Bet::Bet(&local_d0,0,dVar5);
      Bet::selectBetSuperFire10(&local_d0,&local_12c,credits);
      local_108._bet_bet = 0;
      local_108._4_4_ = 0;
      local_108._credit_bet = 0.0;
      local_f8 = 0;
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::vector(&local_60,
               (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                *)&local_108);
      Matrix::Matrix(&local_120,&local_60);
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::~vector(&local_60);
      pdVar1 = local_128;
      Start::Start(&local_c0,*local_128,local_12c);
      Start::StartGameNowSuperFire10(&local_c0,pdVar1,&local_12c);
      Start::~Start(&local_c0);
      Matrix::~Matrix(&local_120);
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 *)&local_108);
      Bet::~Bet(&local_d0);
      PrintGameName::~PrintGameName(&local_12d);
      cVar4 = *local_f0;
      credits = local_128;
    }
    if ((cVar4 == '3') && (local_e8 == 1)) {
      iVar2 = system("CLS");
      if (iVar2 != 0) {
        system("clear");
      }
      PrintGameName::PrintGameName(&local_12d);
      PrintGameName::PrintGameNameWelcomeWisePharaohs5(&local_12d);
      dVar5 = *credits;
      if (dVar5 < 1.0) {
        poVar3 = std::operator<<((ostream *)&std::cout,
                                 "Please Insert Credits in order to play. Minimum is 1 Euro for Min Bet!"
                                );
        std::endl<char,std::char_traits<char>>(poVar3);
        poVar3 = std::operator<<((ostream *)&std::cout,
                                 "----------------------------------------------------------------------"
                                );
        std::endl<char,std::char_traits<char>>(poVar3);
        CreditField::CreditField((CreditField *)&local_c0);
        CreditField::AddCredit((CreditField *)&local_c0,credits);
        CreditField::~CreditField((CreditField *)&local_c0);
        dVar5 = *credits;
      }
      local_12c = 0;
      Bet::Bet(&local_d0,0,dVar5);
      Bet::selectBetWisePharaohs(&local_d0,&local_12c,credits);
      local_108._bet_bet = 0;
      local_108._4_4_ = 0;
      local_108._credit_bet = 0.0;
      local_f8 = 0;
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::vector(&local_78,
               (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                *)&local_108);
      MatrixPharaohs::MatrixPharaohs((MatrixPharaohs *)&local_120,&local_78);
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::~vector(&local_78);
      pdVar1 = local_128;
      Start::Start(&local_c0,*local_128,local_12c);
      Start::StartGameNowWisePharaohs5(&local_c0,pdVar1,&local_12c);
      Start::~Start(&local_c0);
      MatrixPharaohs::~MatrixPharaohs((MatrixPharaohs *)&local_120);
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 *)&local_108);
      Bet::~Bet(&local_d0);
      PrintGameName::~PrintGameName(&local_12d);
      cVar4 = *local_f0;
      credits = local_128;
    }
    if ((cVar4 == '4') && (local_e8 == 1)) {
      iVar2 = system("CLS");
      if (iVar2 != 0) {
        system("clear");
      }
      PrintGameName::PrintGameName(&local_12d);
      PrintGameName::PrintGameNameWelcomeTigersBattle10(&local_12d);
      dVar5 = *credits;
      if (dVar5 < 2.0) {
        poVar3 = std::operator<<((ostream *)&std::cout,
                                 "Please Insert Credits in order to play. Minimum is 2 Euro for Min Bet!"
                                );
        std::endl<char,std::char_traits<char>>(poVar3);
        poVar3 = std::operator<<((ostream *)&std::cout,
                                 "----------------------------------------------------------------------"
                                );
        std::endl<char,std::char_traits<char>>(poVar3);
        CreditField::CreditField((CreditField *)&local_c0);
        CreditField::AddCredit((CreditField *)&local_c0,credits);
        CreditField::~CreditField((CreditField *)&local_c0);
        dVar5 = *credits;
      }
      local_12c = 0;
      Bet::Bet(&local_d0,0,dVar5);
      Bet::selectBetTigersBattle10(&local_d0,&local_12c,credits);
      local_108._bet_bet = 0;
      local_108._4_4_ = 0;
      local_108._credit_bet = 0.0;
      local_f8 = 0;
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::vector(&local_90,
               (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                *)&local_108);
      Matrix::Matrix(&local_120,&local_90);
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::~vector(&local_90);
      pdVar1 = local_128;
      Start::Start(&local_c0,*local_128,local_12c);
      Start::StartGameNowTigersBattle10(&local_c0,pdVar1,&local_12c);
      Start::~Start(&local_c0);
      Matrix::~Matrix(&local_120);
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 *)&local_108);
      Bet::~Bet(&local_d0);
      PrintGameName::~PrintGameName(&local_12d);
      cVar4 = *local_f0;
      credits = local_128;
    }
    if ((cVar4 == '5') && (local_e8 == 1)) {
      iVar2 = system("CLS");
      if (iVar2 != 0) {
        system("clear");
      }
      PrintGameName::PrintGameName((PrintGameName *)&local_d0);
      PrintGameName::PrintGameNameWelcomeKeno((PrintGameName *)&local_d0);
      dVar5 = *credits;
      if (dVar5 < 1.0) {
        poVar3 = std::operator<<((ostream *)&std::cout,
                                 "Please Insert Credits in order to play. Minimum is 1 Euro for Min Bet!"
                                );
        std::endl<char,std::char_traits<char>>(poVar3);
        poVar3 = std::operator<<((ostream *)&std::cout,
                                 "----------------------------------------------------------------------"
                                );
        std::endl<char,std::char_traits<char>>(poVar3);
        CreditField::CreditField((CreditField *)&local_c0);
        CreditField::AddCredit((CreditField *)&local_c0,credits);
        CreditField::~CreditField((CreditField *)&local_c0);
        dVar5 = *credits;
      }
      local_120._matrixVec.
      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start._0_4_ = 0;
      Bet::Bet(&local_108,0,dVar5);
      Bet::selectBetKeno(&local_108,(uint *)&local_120,credits);
      Start::Start(&local_c0,*credits,
                   (uint)local_120._matrixVec.
                         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start);
      Start::StartGameNowKeno(&local_c0,credits,(uint *)&local_120);
      Start::~Start(&local_c0);
      Bet::~Bet(&local_108);
      PrintGameName::~PrintGameName((PrintGameName *)&local_d0);
    }
  } while( true );
}

Assistant:

double SelectGame::selectGame_Option(double & credits) {
	std::string option;
	bool neverExit =false;
	while (neverExit==false) {
		selectGame_Welcome();
		std::cout << "-------------------------------------" << std::endl;
		std::cout << "Choose a game which you want to Play!" << std::endl;
		std::cout << "-------------------------------------" << std::endl;
		std::cout << "Option: 1 for SuperFire 5" << std::endl;
		std::cout << "Option: 2 for SuperFire 10" << std::endl;
		std::cout << "Option: 3 for Wise Pharaohs 5" << std::endl;
		std::cout << "Option: 4 for Tiger's Battle 10" << std::endl;
		std::cout << "Option: 5 for Keno" << std::endl;
		std::cout << "-------------------------------------" << std::endl;
		std::cout << "Press a to add credit!" << std::endl;
		std::cout << "Press c to exit!" << std::endl;
		std::cout << "-------------------------------------" << std::endl;
		std::cout << "Current Credit: " << credits << " Euro!" << std::endl;
		std::cout << "-------------------------------------" << std::endl;
		std::cin >> option;

		if (option[0] == 'a' && option.size() == 1) {
			CreditField addCredit;
			addCredit.AddCredit(credits);
		}
		if (option[0] == 'c' && option.size() == 1) {
			if (credits > 0.0) {
				std::cout << "Cashout..." << std::endl;
				std::cout << "Handpay! Call Attendant! " << credits << " Euro!" << std::endl;
				std::chrono::seconds duration(3);
				std::this_thread::sleep_for(duration);
				credits = 0;
			}
			else {
				std::cout << "Nothing to cashout!" << std::endl;
				std::chrono::seconds duration(3);
				std::this_thread::sleep_for(duration);
			}
			//exit(0);
		}
		if (option[0] == '1' && option.size() == 1) {
			//clear console
			if (system("CLS")) system("clear");
			//welcome game
			PrintGameName printWelcome;
			printWelcome.PrintGameNameWelcome();
			//credit
			if (credits < 1) {
				std::cout << "Please Insert Credits in order to play. Minimum is 1 Euro for Min Bet!" << std::endl;
				std::cout << "----------------------------------------------------------------------" << std::endl;
				CreditField myCredit;
				myCredit.AddCredit(credits);
			}
			unsigned int bet = 0;
			Bet currentBet(bet, credits);
			currentBet.selectBet(bet, credits);

			//matrix 2D
			std::vector<std::vector<int>> myMatrixVector;
			Matrix myMatrix(myMatrixVector);

			//starting a game
			Start startGame(credits, bet);
			startGame.StartGameNow(credits, bet);
		}
		if (option[0] == '2' && option.size() == 1) {
				//clear console
			if (system("CLS")) system("clear");
				//welcome game
				PrintGameName printWelcome;
				printWelcome.PrintGameNameWelcomeSuperFire10();
				//credit
			if (credits < 2) {
					std::cout << "Please Insert Credits in order to play. Minimum is 2 Euro for Min Bet!" << std::endl;
					std::cout << "----------------------------------------------------------------------" << std::endl;
					CreditField myCredit;
					myCredit.AddCredit(credits);
			}
			
			//bet
			unsigned int bet = 0;
			Bet currentBet(bet, credits);
			currentBet.selectBetSuperFire10(bet, credits);

			//matrix 2D
			std::vector<std::vector<int>> myMatrixVector;
			Matrix myMatrix(myMatrixVector);

			//starting a game
			Start startGame(credits, bet);
			startGame.StartGameNowSuperFire10(credits, bet);
		}
		// Wise Pharaohs 5 
		if (option[0] == '3' && option.size() == 1) {
			//clear console
			if (system("CLS")) system("clear");
			//welcome game
			PrintGameName printWelcome;
			printWelcome.PrintGameNameWelcomeWisePharaohs5();
			//credit
			if (credits < 1) {
				std::cout << "Please Insert Credits in order to play. Minimum is 1 Euro for Min Bet!" << std::endl;
				std::cout << "----------------------------------------------------------------------" << std::endl;
				CreditField myCredit;
				myCredit.AddCredit(credits);
			}
			unsigned int bet = 0;
			Bet currentBet(bet, credits);
			currentBet.selectBetWisePharaohs(bet, credits);

			//matrix 2D
			//need to change
			std::vector<std::vector<int>> myMatrixVector;
			MatrixPharaohs myMatrix(myMatrixVector);

			//starting a game
			Start startGame(credits, bet);
			startGame.StartGameNowWisePharaohs5(credits, bet); 
		}

		if (option[0] == '4' && option.size() == 1) {
			//clear console
			if (system("CLS")) system("clear");
			//welcome game
			PrintGameName printWelcome;
			printWelcome.PrintGameNameWelcomeTigersBattle10(); // changed
			//credit
			if (credits < 2) {
				std::cout << "Please Insert Credits in order to play. Minimum is 2 Euro for Min Bet!" << std::endl;
				std::cout << "----------------------------------------------------------------------" << std::endl;
				CreditField myCredit;
				myCredit.AddCredit(credits);
			}
			unsigned int bet = 0;
			Bet currentBet(bet, credits);
			currentBet.selectBetTigersBattle10(bet, credits); //changed  bet 2 euro

			//matrix 2D
			std::vector<std::vector<int>> myMatrixVector;
			Matrix myMatrix(myMatrixVector);

			//starting a game
			Start startGame(credits, bet);
			startGame.StartGameNowTigersBattle10(credits, bet); //changed
		}
		if (option[0] == '5' && option.size() == 1) {
			//clear console
			if (system("CLS")) system("clear");
			//welcome game
			PrintGameName printWelcome;
			printWelcome.PrintGameNameWelcomeKeno();
			//credit
			if (credits < 1) {
				std::cout << "Please Insert Credits in order to play. Minimum is 1 Euro for Min Bet!" << std::endl;
				std::cout << "----------------------------------------------------------------------" << std::endl;
				CreditField myCredit;
				myCredit.AddCredit(credits);
			}
			unsigned int bet = 0;
			Bet currentBet(bet, credits);
			currentBet.selectBetKeno(bet, credits);

			//matrix 2D
			/*std::vector<std::vector<int>> myMatrixVector;
			Matrix myMatrix(myMatrixVector);*/

			//starting a game

			Start startGame(credits, bet);
			startGame.StartGameNowKeno(credits, bet);
		}
	}
	return credits;
}